

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_rtree.cpp
# Opt level: O0

bool SearchHelper(ON_RTreeNode *a_node,ON_RTreeBBox *a_rect,ON_RTreeSearchResult *a_result)

{
  int iVar1;
  int iVar2;
  anon_union_8_2_fca59aa2_for_ON_RTreeBranch_1 aVar3;
  bool bVar4;
  ON_RTreeBranch *branch;
  int count;
  int i;
  ON_RTreeSearchResult *a_result_local;
  ON_RTreeBBox *a_rect_local;
  ON_RTreeNode *a_node_local;
  
  iVar1 = a_node->m_count;
  if (0 < iVar1) {
    bVar4 = ON_RTreeNode::IsInternalNode(a_node);
    if (bVar4) {
      for (branch._4_4_ = 0; branch._4_4_ < iVar1; branch._4_4_ = branch._4_4_ + 1) {
        bVar4 = OverlapHelper(a_rect,&a_node->m_branch[branch._4_4_].m_rect);
        if ((bVar4) &&
           (bVar4 = SearchHelper(a_node->m_branch[branch._4_4_].field_1.m_child,a_rect,a_result),
           !bVar4)) {
          return false;
        }
      }
    }
    else {
      for (branch._4_4_ = 0; branch._4_4_ < iVar1; branch._4_4_ = branch._4_4_ + 1) {
        bVar4 = OverlapHelper(a_rect,&a_node->m_branch[branch._4_4_].m_rect);
        if (bVar4) {
          if (a_result->m_capacity <= a_result->m_count) {
            return false;
          }
          aVar3 = a_node->m_branch[branch._4_4_].field_1;
          iVar2 = a_result->m_count;
          a_result->m_count = iVar2 + 1;
          *(anon_union_8_2_fca59aa2_for_ON_RTreeBranch_1 *)(a_result->m_id + iVar2) = aVar3;
        }
      }
    }
  }
  return true;
}

Assistant:

static
bool SearchHelper(const ON_RTreeNode* a_node, const ON_RTreeBBox* a_rect, ON_RTreeSearchResult& a_result)
{
  int i, count;

  if ( (count = a_node->m_count) > 0 )
  {
    const ON_RTreeBranch* branch = a_node->m_branch;
    if(a_node->IsInternalNode()) 
    {
      // a_node is an internal node - search m_branch[].m_child as needed
      for( i=0; i < count; ++i )
      {
        if(OverlapHelper(a_rect, &branch[i].m_rect))
        {
          if(!SearchHelper(branch[i].m_child, a_rect, a_result) )
          {
            return false; // Don't continue searching
          }
        }
      }
    }
    else
    {
      // a_node is a leaf node - return m_branch[].m_id values
      for(i=0; i < count; ++i)
      {
        if(OverlapHelper(a_rect, &branch[i].m_rect))
        {
          if ( a_result.m_count >= a_result.m_capacity )
            return false; // No more space for results
          a_result.m_id[a_result.m_count++] = branch[i].m_id;
        }
      }
    }
  }

  return true; // Continue searching
}